

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Snes_Spc.cpp
# Opt level: O3

void __thiscall Snes_Spc::reset_buf(Snes_Spc *this)

{
  (this->m).extra_buf[0] = 0;
  (this->m).extra_buf[1] = 0;
  (this->m).extra_buf[2] = 0;
  (this->m).extra_buf[3] = 0;
  (this->m).extra_buf[4] = 0;
  (this->m).extra_buf[5] = 0;
  (this->m).extra_buf[6] = 0;
  (this->m).extra_buf[7] = 0;
  (this->m).extra_pos = (this->m).extra_buf + 8;
  (this->m).buf_begin = (sample_t_conflict1 *)0x0;
  Spc_Dsp::set_output(&this->dsp,(sample_t_conflict1 *)0x0,0);
  return;
}

Assistant:

void Snes_Spc::reset_buf()
{
	// Start with half extra buffer of silence
	sample_t* out = m.extra_buf;
	while ( out < &m.extra_buf [extra_size / 2] )
		*out++ = 0;
	
	m.extra_pos = out;
	m.buf_begin = 0;
	
	dsp.set_output( 0, 0 );
}